

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_hv.c
# Opt level: O0

dtl_av_t * dtl_hv_keys(dtl_hv_t *self)

{
  int32_t iVar1;
  int32_t iVar2;
  char *cstr;
  dtl_sv_t *dv;
  char *key;
  int32_t i;
  int32_t numItems;
  adt_ary_t *tmp;
  dtl_av_t *array;
  dtl_hv_t *self_local;
  
  if (self == (dtl_hv_t *)0x0) {
    self_local = (dtl_hv_t *)0x0;
  }
  else {
    _i = (adt_ary_t *)0x0;
    self_local = (dtl_hv_t *)dtl_av_new();
    if ((self_local != (dtl_hv_t *)0x0) && (_i = adt_ary_new(free), _i != (adt_ary_t *)0x0)) {
      iVar1 = adt_hash_keys(self->pAny,_i);
      if (0 < iVar1) {
        dtl_av_clear((dtl_av_t *)self_local);
        for (key._0_4_ = 0; (int)key < iVar1; key._0_4_ = (int)key + 1) {
          cstr = (char *)adt_ary_value(_i,(int)key);
          if (cstr == (char *)0x0) {
            __assert_fail("key != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_type/src/dtl_hv.c"
                          ,0xbc,"dtl_av_t *dtl_hv_keys(const dtl_hv_t *)");
          }
          dv = dtl_sv_make_cstr(cstr);
          dtl_av_push((dtl_av_t *)self_local,(dtl_dv_t *)dv,false);
        }
      }
      iVar2 = dtl_av_length((dtl_av_t *)self_local);
      if (iVar2 != iVar1) {
        __assert_fail("dtl_av_length(array) == numItems",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_type/src/dtl_hv.c"
                      ,0xc0,"dtl_av_t *dtl_hv_keys(const dtl_hv_t *)");
      }
    }
    if (_i != (adt_ary_t *)0x0) {
      adt_ary_delete(_i);
    }
  }
  return (dtl_av_t *)self_local;
}

Assistant:

dtl_av_t* dtl_hv_keys(const dtl_hv_t *self)
{
	if( (self != 0) )
	{
	   dtl_av_t *array = 0;
	   adt_ary_t *tmp = 0; //adt_ary returns a list of cstr (C strings).
	   array = dtl_av_new();
	   if (array != 0)
	   {
	      tmp = adt_ary_new(vfree);
	   }
	   if ( (array != 0) && (tmp != 0) )
	   {
	      int32_t numItems = adt_hash_keys(self->pAny, tmp);
	      if (numItems > 0)
	      {
	         int32_t i;
	         dtl_av_clear(array);
	         for (i=0; i<numItems; i++)
	         {
	            const char *key = (const char *) adt_ary_value(tmp, i);
	            assert(key != 0);
	            dtl_av_push(array, (dtl_dv_t*) dtl_sv_make_cstr(key), false);
	         }
	      }
	      assert(dtl_av_length(array) == numItems);
	   }
	   if (tmp != 0)
	   {
	      adt_ary_delete(tmp);
	   }
	   return array;
	}
	return (dtl_av_t*) 0;
}